

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

void __thiscall Assimp::D3DS::Material::Material(Material *this,Material *other)

{
  ai_real aVar1;
  
  this->_vptr_Material = (_func_int **)&PTR__Material_0075ae68;
  std::__cxx11::string::string((string *)&this->mName,(string *)&other->mName);
  (this->mDiffuse).r = (other->mDiffuse).r;
  (this->mDiffuse).g = (other->mDiffuse).g;
  (this->mDiffuse).b = (other->mDiffuse).b;
  aVar1 = other->mShininessStrength;
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = aVar1;
  (this->mSpecular).r = (other->mSpecular).r;
  (this->mSpecular).g = (other->mSpecular).g;
  (this->mSpecular).b = (other->mSpecular).b;
  (this->mAmbient).r = (other->mAmbient).r;
  (this->mAmbient).g = (other->mAmbient).g;
  (this->mAmbient).b = (other->mAmbient).b;
  aVar1 = other->mTransparency;
  this->mShading = other->mShading;
  this->mTransparency = aVar1;
  Texture::Texture(&this->sTexDiffuse,&other->sTexDiffuse);
  Texture::Texture(&this->sTexOpacity,&other->sTexOpacity);
  Texture::Texture(&this->sTexSpecular,&other->sTexSpecular);
  Texture::Texture(&this->sTexReflective,&other->sTexReflective);
  Texture::Texture(&this->sTexBump,&other->sTexBump);
  Texture::Texture(&this->sTexEmissive,&other->sTexEmissive);
  Texture::Texture(&this->sTexShininess,&other->sTexShininess);
  this->mBumpHeight = other->mBumpHeight;
  (this->mEmissive).r = (other->mEmissive).r;
  (this->mEmissive).g = (other->mEmissive).g;
  (this->mEmissive).b = (other->mEmissive).b;
  Texture::Texture(&this->sTexAmbient,&other->sTexAmbient);
  this->mTwoSided = other->mTwoSided;
  return;
}

Assistant:

Material(const Material &other)            = default;